

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_function_impl.h
# Opt level: O1

void __thiscall
dlib::any_function<void(dlib::vector<long,2l>const&,bool,unsigned_long),void,3ul>::
any_function<dlib::member_function_pointer<dlib::vector<long,2l>const&,bool,unsigned_long,void>>
          (any_function<void(dlib::vector<long,2l>const&,bool,unsigned_long),void,3ul> *this,
          member_function_pointer<const_dlib::vector<long,_2L>_&,_bool,_unsigned_long,_void> *item)

{
  long *plVar1;
  undefined8 *puVar2;
  pointer *__ptr;
  
  *(undefined8 *)this = 0;
  puVar2 = (undefined8 *)operator_new(0x50);
  *puVar2 = &PTR__derived_00322d98;
  puVar2[8] = puVar2 + 2;
  (**(code **)(*(item->super_mfp_kernel_1_base_class<3UL>).mp_memory.data + 0x10))();
  plVar1 = *(long **)this;
  *(undefined8 **)this = puVar2;
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 8))();
    return;
  }
  return;
}

Assistant:

any_function (
    const T& item
)
{
    typedef typename basic_type<T>::type U;
    data.reset(new derived<U,function_type>(item));
}